

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O0

int lj_sysprof_set_on_stop(luam_Sysprof_on_stop on_stop)

{
  int iVar1;
  luam_Sysprof_on_stop in_RDI;
  sysprof *sp;
  int local_4;
  
  if ((sysprof.state == 0) && (in_RDI != (luam_Sysprof_on_stop)0x0)) {
    sysprof.on_stop = in_RDI;
    iVar1 = is_unconfigured(&sysprof);
    if (iVar1 == 0) {
      sysprof.state = 0;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int lj_sysprof_set_on_stop(luam_Sysprof_on_stop on_stop) {
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_IDLE || on_stop == NULL)
    return PROFILE_ERRUSE;

  sp->on_stop = on_stop;
  if (!is_unconfigured(sp)) {
    sp->state = SPS_IDLE;
  }
  return PROFILE_SUCCESS;
}